

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98player.cpp
# Opt level: O0

void __thiscall S98Player::ParseFile(S98Player *this,UINT32 ticks)

{
  bool bVar1;
  UINT32 ticks_local;
  S98Player *this_local;
  
  this->_playTick = ticks + this->_playTick;
  if ((this->_playState & 2) == 0) {
    while( true ) {
      bVar1 = false;
      if (this->_fileTick <= this->_playTick) {
        bVar1 = (this->_playState & 2) == 0;
      }
      if (!bVar1) break;
      DoCommand(this);
    }
  }
  return;
}

Assistant:

void S98Player::ParseFile(UINT32 ticks)
{
	_playTick += ticks;
	if (_playState & PLAYSTATE_END)
		return;
	
	while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
		DoCommand();
	
	return;
}